

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void Am_Connection::Wait_For_Connect(void)

{
  int iVar1;
  timeval select_timeout;
  fd_set read_fd;
  timeval local_98;
  fd_set local_88;
  
  local_98.tv_sec = 1;
  local_98.tv_usec = 0;
  local_88.fds_bits[0xe] = 0;
  local_88.fds_bits[0xf] = 0;
  local_88.fds_bits[0xc] = 0;
  local_88.fds_bits[0xd] = 0;
  local_88.fds_bits[10] = 0;
  local_88.fds_bits[0xb] = 0;
  local_88.fds_bits[8] = 0;
  local_88.fds_bits[9] = 0;
  local_88.fds_bits[6] = 0;
  local_88.fds_bits[7] = 0;
  local_88.fds_bits[4] = 0;
  local_88.fds_bits[5] = 0;
  iVar1 = m_parent_socket + 0x3f;
  if (-1 < m_parent_socket) {
    iVar1 = m_parent_socket;
  }
  local_88.fds_bits[2] = 0;
  local_88.fds_bits[3] = 0;
  local_88.fds_bits[0] = 0;
  local_88.fds_bits[1] = 0;
  local_88.fds_bits[iVar1 >> 6] =
       local_88.fds_bits[iVar1 >> 6] | 1L << ((byte)m_parent_socket & 0x3f);
  select(m_parent_socket + 1,&local_88,(fd_set *)0x0,(fd_set *)0x0,&local_98);
  iVar1 = m_parent_socket + 0x3f;
  if (-1 < m_parent_socket) {
    iVar1 = m_parent_socket;
  }
  if (((ulong)local_88.fds_bits[iVar1 >> 6] >> ((ulong)(uint)m_parent_socket & 0x3f) & 1) != 0) {
    Handle_Sockets((fd_set *)&local_88);
  }
  return;
}

Assistant:

void
Am_Connection::Wait_For_Connect(void)
{
  struct timeval select_timeout;
  select_timeout.tv_sec = 1;
  select_timeout.tv_usec = 0;

  fd_set read_fd;
  int nfds;
  FD_ZERO(&read_fd);
  FD_SET(m_parent_socket, &read_fd);

  nfds = m_parent_socket + 1;

  (void)select(nfds, &read_fd, nullptr, nullptr, &select_timeout);

  if (FD_ISSET(m_parent_socket, &read_fd))
    Am_Connection::Handle_Sockets(&read_fd);
}